

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::NewCharClass(CharClass *cc,ParseFlags flags)

{
  Regexp *this;
  Regexp *re;
  ParseFlags flags_local;
  CharClass *cc_local;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(this,kRegexpCharClass,flags);
  (this->field_7).field_3.cc_ = cc;
  return this;
}

Assistant:

Regexp* Regexp::NewCharClass(CharClass* cc, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpCharClass, flags);
  re->cc_ = cc;
  return re;
}